

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::MergeFrom
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  bool bVar1;
  uint32 uVar2;
  int32 iVar3;
  void *pvVar4;
  ValueUnion VVar5;
  LogMessage *other;
  LogFinisher local_61;
  ValueUnion local_60;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb81d);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar4 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar4 & 0xfffffffffffffffe));
  }
  uVar2 = from->_oneof_case_[0];
  if ((int)uVar2 < 0x1e) {
    if (uVar2 == 10) {
      local_60 = from->value_;
      if (this->_oneof_case_[0] != 10) {
        clear_value(this);
        this->_oneof_case_[0] = 10;
      }
      this->value_ = local_60;
    }
    else if (uVar2 == 0x14) {
      VVar5 = from->value_;
      if (this->_oneof_case_[0] == 0x14) {
        if ((string *)(this->value_).longvalue_ !=
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          std::__cxx11::string::_M_assign((string *)(this->value_).longvalue_);
          return;
        }
      }
      else {
        clear_value(this);
        this->_oneof_case_[0] = 0x14;
        this->value_ = (ValueUnion)
                       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      }
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->value_).stringvalue_,(string *)VVar5);
    }
  }
  else if (uVar2 == 0x1e) {
    iVar3 = (from->value_).intvalue_;
    if (this->_oneof_case_[0] != 0x1e) {
      clear_value(this);
      this->_oneof_case_[0] = 0x1e;
    }
    (this->value_).intvalue_ = iVar3;
  }
  else if (uVar2 == 0x28) {
    VVar5 = from->value_;
    if (this->_oneof_case_[0] != 0x28) {
      clear_value(this);
      this->_oneof_case_[0] = 0x28;
    }
    this->value_ = VVar5;
  }
  else if (uVar2 == 0x32) {
    bVar1 = (from->value_).boolvalue_;
    if (this->_oneof_case_[0] != 0x32) {
      clear_value(this);
      this->_oneof_case_[0] = 0x32;
    }
    (this->value_).boolvalue_ = bVar1;
  }
  return;
}

Assistant:

void CustomLayerParams_CustomLayerParamValue::MergeFrom(const CustomLayerParams_CustomLayerParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      set_doublevalue(from.doublevalue());
      break;
    }
    case kStringValue: {
      set_stringvalue(from.stringvalue());
      break;
    }
    case kIntValue: {
      set_intvalue(from.intvalue());
      break;
    }
    case kLongValue: {
      set_longvalue(from.longvalue());
      break;
    }
    case kBoolValue: {
      set_boolvalue(from.boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
}